

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeForces.cpp
# Opt level: O2

void __thiscall
OpenMD::FluctuatingChargeForces::getSelfInteraction
          (FluctuatingChargeForces *this,int atid,RealType charge,RealType *potential,
          RealType *force)

{
  double dVar1;
  DoublePolynomial vself;
  RealType local_60;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_58;
  
  local_60 = charge;
  if (this->initialized_ == false) {
    initialize(this);
  }
  FluctuatingChargeAtomData::operator=
            (&this->data,
             (this->FQMap).
             super__Vector_base<OpenMD::FluctuatingChargeAtomData,_std::allocator<OpenMD::FluctuatingChargeAtomData>_>
             ._M_impl.super__Vector_impl_data._M_start +
             (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[atid]);
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::_Rb_tree(&local_58,
             (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)&(this->data).vself_);
  dVar1 = Polynomial<double>::evaluate((Polynomial<double> *)&local_58,&local_60);
  *potential = dVar1 + *potential;
  dVar1 = Polynomial<double>::evaluateDerivative((Polynomial<double> *)&local_58,&local_60);
  *force = *force - dVar1;
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&local_58);
  return;
}

Assistant:

void FluctuatingChargeForces::getSelfInteraction(int atid, RealType charge,
                                                   RealType& potential,
                                                   RealType& force) {
    if (!initialized_) initialize();

    data = FQMap[FQtids[atid]];

    DoublePolynomial vself = data.vself_;
    potential += vself.evaluate(charge);
    force -= vself.evaluateDerivative(charge);

    return;
  }